

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O1

Token __thiscall slang::syntax::SyntaxNode::getLastToken(SyntaxNode *this)

{
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *__v;
  size_t sVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar3;
  ConstGetChildVisitor *in_RCX;
  unsigned_long *in_R8;
  long lVar4;
  Token TVar5;
  Token result;
  ConstTokenOrSyntax child;
  Token local_50;
  undefined1 local_40 [24];
  char local_28;
  undefined1 auVar6 [14];
  Info *pIVar7;
  
  sVar1 = getChildCount(this);
  if (0 < (long)sVar1) {
    lVar4 = sVar1 + 1;
    __v = (variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)(local_40 + 8);
    do {
      local_40._0_8_ = lVar4 + -2;
      detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,(anonymous_namespace)::ConstGetChildVisitor,unsigned_long&>
                ((ConstTokenOrSyntax *)__v,(detail *)this,(SyntaxNode *)local_40,in_RCX,in_R8);
      if (local_28 == '\0') {
        pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
        if (pvVar3->info != (Info *)0x0) {
          pvVar3 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (local_40 + 8));
          TVar5.kind = pvVar3->kind;
          auVar6[2] = pvVar3->field_0x2;
          auVar6[3] = (pvVar3->numFlags).raw;
          auVar6._4_4_ = pvVar3->rawLen;
          register0x00000010 = pvVar3->info;
          return TVar5;
        }
      }
      else {
        ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
        if (*ppSVar2 != (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
          ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
          local_50 = getLastToken(*ppSVar2);
          if (local_50.info != (Info *)0x0) {
            return local_50;
          }
        }
      }
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  parsing::Token::Token(&local_50);
  return local_50;
}

Assistant:

parsing::Token SyntaxNode::getLastToken() const {
    size_t childCount = getChildCount();
    for (ptrdiff_t i = ptrdiff_t(childCount) - 1; i >= 0; i--) {
        auto child = getChild(size_t(i));
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getLastToken();
            if (result)
                return result;
        }
    }
    return Token();
}